

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_script.cpp
# Opt level: O2

UniValue *
DeriveAddresses(UniValue *__return_storage_ptr__,Descriptor *desc,int64_t range_begin,
               int64_t range_end,FlatSigningProvider *key_provider)

{
  string str;
  UniValue val;
  pointer pCVar1;
  bool bVar2;
  int iVar3;
  UniValue *pUVar4;
  CScript *scriptPubKey;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffffd88;
  undefined8 in_stack_fffffffffffffd98;
  undefined **ppuVar5;
  undefined8 uStack_240;
  vector<CScript,_std::allocator<CScript>_> scripts;
  UniValue local_220;
  string local_1c8;
  CTxDestination dest;
  FlatSigningProvider provider;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = local_48;
  local_50 = 0;
  local_48[0] = 0;
  str._M_string_length = (size_type)__return_storage_ptr__;
  str._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd88;
  str.field_2._M_allocated_capacity = in_stack_fffffffffffffd98;
  str.field_2._8_8_ = desc;
  UniValue::UniValue(__return_storage_ptr__,VARR,str);
  std::__cxx11::string::~string((string *)&local_58);
  ppuVar5 = &PTR__FlatSigningProvider_00a1ca50;
  do {
    if (range_end < range_begin) {
      if ((__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        pUVar4 = (UniValue *)__cxa_allocate_exception(0x58);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&provider,"Unexpected empty result",(allocator<char> *)&dest);
        JSONRPCError(pUVar4,-1,(string *)&provider);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar4,&UniValue::typeinfo,UniValue::~UniValue);
        }
      }
      else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
LAB_002f419e:
      __stack_chk_fail();
    }
    provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header;
    provider.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
    provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &provider.origins._M_t._M_impl.super__Rb_tree_header._M_header;
    provider.origins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &provider.keys._M_t._M_impl.super__Rb_tree_header._M_header;
    provider.keys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header;
    provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    scripts.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    scripts.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    scripts.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    provider.super_SigningProvider._vptr_SigningProvider = (_func_int **)ppuVar5;
    provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    iVar3 = (*desc->_vptr_Descriptor[8])
                      (desc,range_begin & 0xffffffff,key_provider,&scripts,&provider,0);
    pCVar1 = scripts.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
             super__Vector_impl_data._M_finish;
    scriptPubKey = scripts.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if ((char)iVar3 == '\0') {
      pUVar4 = (UniValue *)__cxa_allocate_exception(0x58);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&dest,"Cannot derive script without private keys",
                 (allocator<char> *)&local_1c8);
      JSONRPCError(pUVar4,-5,(string *)&dest);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pUVar4,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_002f419e;
    }
    for (; scriptPubKey != pCVar1; scriptPubKey = scriptPubKey + 1) {
      dest.
      super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ._M_u._16_8_ = 0;
      dest.
      super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ._M_u._24_8_ = 0;
      dest.
      super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ._M_u._0_8_ = 0;
      dest.
      super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ._M_u._8_8_ = 0;
      dest.
      super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ._M_index = '\0';
      bVar2 = ExtractDestination(scriptPubKey,&dest);
      if (bVar2) {
        EncodeDestination_abi_cxx11_(&local_1c8,&dest);
        UniValue::
        UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (&local_220,&local_1c8);
        val.val._M_dataplus._M_p = (pointer)__return_storage_ptr__;
        val._0_8_ = in_stack_fffffffffffffd88;
        val.val._M_string_length = (size_type)ppuVar5;
        val.val.field_2._M_allocated_capacity = (size_type)desc;
        val.val.field_2._8_8_ = key_provider;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)range_end;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)range_begin;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)uStack_240;
        val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)scripts.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                      super__Vector_impl_data._M_start;
        val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)scripts.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                      super__Vector_impl_data._M_finish;
        val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)scripts.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
        UniValue::push_back(__return_storage_ptr__,val);
        UniValue::~UniValue(&local_220);
        std::__cxx11::string::~string((string *)&local_1c8);
      }
      else if (((ulong)((long)scripts.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)scripts.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                             super__Vector_impl_data._M_start) < 0x21) ||
              (dest.
               super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               .
               super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               .
               super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               .
               super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               .
               super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               .
               super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               ._M_index != '\x01')) {
        pUVar4 = (UniValue *)__cxa_allocate_exception(0x58);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1c8,"Descriptor does not have a corresponding address",
                   (allocator<char> *)((long)&uStack_240 + 7));
        JSONRPCError(pUVar4,-5,&local_1c8);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar4,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_002f419e;
      }
      std::__detail::__variant::
      _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                           *)&dest);
    }
    std::vector<CScript,_std::allocator<CScript>_>::~vector(&scripts);
    FlatSigningProvider::~FlatSigningProvider(&provider);
    range_begin = range_begin + 1;
  } while( true );
}

Assistant:

static UniValue DeriveAddresses(const Descriptor* desc, int64_t range_begin, int64_t range_end, FlatSigningProvider& key_provider)
{
    UniValue addresses(UniValue::VARR);

    for (int64_t i = range_begin; i <= range_end; ++i) {
        FlatSigningProvider provider;
        std::vector<CScript> scripts;
        if (!desc->Expand(i, key_provider, scripts, provider)) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Cannot derive script without private keys");
        }

        for (const CScript& script : scripts) {
            CTxDestination dest;
            if (!ExtractDestination(script, dest)) {
                // ExtractDestination no longer returns true for P2PK since it doesn't have a corresponding address
                // However combo will output P2PK and should just ignore that script
                if (scripts.size() > 1 && std::get_if<PubKeyDestination>(&dest)) {
                    continue;
                }
                throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Descriptor does not have a corresponding address");
            }

            addresses.push_back(EncodeDestination(dest));
        }
    }

    // This should not be possible, but an assert seems overkill:
    if (addresses.empty()) {
        throw JSONRPCError(RPC_MISC_ERROR, "Unexpected empty result");
    }

    return addresses;
}